

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O2

Error * ot::commissioner::security_material::Init
                  (Error *__return_storage_ptr__,Config *aDefaultConfig)

{
  char cVar1;
  char *from;
  char *to;
  format_string_checker<char> *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  allocator local_e1;
  writer write;
  string root;
  undefined1 local_b8 [32];
  format_string_checker<char> local_98;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&root,(string *)&aDefaultConfig->mThreadSMRoot);
  if (root._M_string_length == 0) {
    getenv("THREAD_SM_ROOT");
    std::__cxx11::string::assign((char *)&root);
    if (root._M_string_length == 0) {
      if (gVerbose == '\x01') {
        std::__cxx11::string::string
                  ((string *)&local_98,"ThreadSMRoot value is not available",(allocator *)local_b8);
        Console::Write((string *)&local_98,kYellow);
        this = &local_98;
      }
      else {
        std::__cxx11::string::string((string *)local_b8,"security-materials",&local_e1);
        local_98.types_[0] = none_type;
        local_98.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "ThreadSMRoot value is not available";
        local_98.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
        local_98.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_98.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_98.parse_funcs_[0] = (parse_func)0x0;
        from = "ThreadSMRoot value is not available";
        write.handler_ = &local_98;
        local_98.context_.types_ = local_98.types_;
        while (from != "") {
          cVar1 = *from;
          to = from;
          while (cVar1 != '{') {
            to = to + 1;
            if (to == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write,from,"");
              goto LAB_001c7611;
            }
            cVar1 = *to;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,to);
          from = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (to,"",&local_98);
        }
LAB_001c7611:
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_98;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_48,(v10 *)"ThreadSMRoot value is not available",(string_view)ZEXT816(0x23)
                   ,args);
        Log(kDebug,(string *)local_b8,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        this = (format_string_checker<char> *)local_b8;
      }
      std::__cxx11::string::~string((string *)this);
    }
  }
  std::__cxx11::string::string((string *)&local_68,(string *)&root);
  SMRoot::Set((SMRoot *)smRoot,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::~string((string *)&root);
  return __return_storage_ptr__;
}

Assistant:

Error Init(const Config &aDefaultConfig)
{
    std::string root = aDefaultConfig.mThreadSMRoot;

    if (root.empty())
    {
        root = SafeStr(getenv("THREAD_SM_ROOT"));
        if (root.empty())
        {
            if (gVerbose)
            {
                Console::Write(SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE, Console::Color::kYellow);
            }
            else
            {
                LOG_DEBUG(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE);
            }
        }
    }
    smRoot.Set(root);
    return ERROR_NONE;
}